

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O1

UINT16 TPM2B_CREATION_DATA_Marshal(TPM2B_CREATION_DATA *source,BYTE **buffer,INT32 *size)

{
  int iVar1;
  BYTE *a;
  UINT16 i;
  
  a = *buffer;
  *buffer = a + 2;
  i = TPMS_CREATION_DATA_Marshal(&source->creationData,buffer,size);
  if ((size == (INT32 *)0x0) || (iVar1 = *size, *size = iVar1 + -2, 1 < iVar1)) {
    Uint16ToByteArray(i,a);
  }
  return i + 2;
}

Assistant:

UINT16
TPM2B_CREATION_DATA_Marshal(TPM2B_CREATION_DATA *source, BYTE **buffer, INT32 *size)
{
    UINT16    result = 0;
    BYTE      *sizeField = *buffer;
    // Advance buffer pointer by canonical size of a UINT16
    *buffer += 2;
    // Marshal the structure
    result = (UINT16)(result + TPMS_CREATION_DATA_Marshal((TPMS_CREATION_DATA *)&(source->creationData), buffer, size));
    // Marshal the size
    result = (UINT16)(result + UINT16_Marshal(&result, &sizeField, size));
    return result;
}